

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des3_ctrl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  int iVar2;
  DES_cblock *in_RCX;
  int in_ESI;
  int kl;
  DES_cblock *deskey;
  EVP_CIPHER_CTX *in_stack_00000060;
  uchar *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_ESI == 6) {
    iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000060);
    if ((-1 < iVar1) && (iVar2 = RAND_priv_bytes(in_stack_ffffffffffffffc8,0), 0 < iVar2)) {
      DES_set_odd_parity(in_RCX);
      if (0xf < iVar1) {
        DES_set_odd_parity(in_RCX + 1);
      }
      if (0x17 < iVar1) {
        DES_set_odd_parity(in_RCX + 2);
      }
      return 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int des3_ctrl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{

    DES_cblock *deskey = ptr;
    int kl;

    switch (type) {
    case EVP_CTRL_RAND_KEY:
        kl = EVP_CIPHER_CTX_get_key_length(ctx);
        if (kl < 0 || RAND_priv_bytes(ptr, kl) <= 0)
            return 0;
        DES_set_odd_parity(deskey);
        if (kl >= 16)
            DES_set_odd_parity(deskey + 1);
        if (kl >= 24)
            DES_set_odd_parity(deskey + 2);
        return 1;

    default:
        return -1;
    }
}